

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcCableSegmentType::IfcCableSegmentType(IfcCableSegmentType *this)

{
  *(undefined ***)&this->field_0x1e0 = &PTR__Object_00806870;
  *(undefined8 *)&this->field_0x1e8 = 0;
  *(char **)&this->field_0x1f0 = "IfcCableSegmentType";
  Schema_2x3::IfcFlowSegmentType::IfcFlowSegmentType
            (&this->super_IfcFlowSegmentType,&PTR_construction_vtable_24__00891318);
  *(undefined8 *)&(this->super_IfcFlowSegmentType).field_0x1b8 = 0;
  *(undefined8 *)
   &(this->super_IfcFlowSegmentType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject =
       0x891198;
  *(undefined8 *)&this->field_0x1e0 = 0x891300;
  *(undefined8 *)
   &(this->super_IfcFlowSegmentType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
    field_0x88 = 0x8911c0;
  (this->super_IfcFlowSegmentType).super_IfcDistributionFlowElementType.
  super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>._vptr_ObjectHelper =
       (_func_int **)0x8911e8;
  *(undefined8 *)
   &(this->super_IfcFlowSegmentType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
    field_0xf0 = 0x891210;
  *(undefined8 *)
   &(this->super_IfcFlowSegmentType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.field_0x148 =
       0x891238;
  *(undefined8 *)
   &(this->super_IfcFlowSegmentType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.field_0x180 = 0x891260;
  *(undefined8 *)
   &(this->super_IfcFlowSegmentType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.field_0x190 = 0x891288;
  *(undefined8 *)
   &(this->super_IfcFlowSegmentType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.field_0x1a0 = 0x8912b0;
  *(undefined8 *)&(this->super_IfcFlowSegmentType).super_IfcDistributionFlowElementType.field_0x1b0
       = 0x8912d8;
  *(undefined1 **)&(this->super_IfcFlowSegmentType).field_0x1c0 = &this->field_0x1d0;
  *(undefined8 *)&this->field_0x1c8 = 0;
  this->field_0x1d0 = 0;
  return;
}

Assistant:

IfcCableSegmentType() : Object("IfcCableSegmentType") {}